

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

bool __thiscall
duckdb::HashJoinGlobalSourceState::AssignTask
          (HashJoinGlobalSourceState *this,HashJoinGlobalSinkState *sink,
          HashJoinLocalSourceState *lstate)

{
  idx_t iVar1;
  bool bVar2;
  ulong uVar3;
  pointer pPVar4;
  pointer this_00;
  InternalException *this_01;
  ulong uVar5;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> local_58;
  string local_48;
  
  local_58._M_device = &(this->super_GlobalSourceState).super_StateWithBlockableTasks.lock;
  local_58._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_58);
  local_58._M_owns = true;
  switch((this->global_stage)._M_i) {
  case BUILD:
    if (this->build_chunk_idx != this->build_chunk_count) {
      lstate->local_stage = (this->global_stage)._M_i;
      iVar1 = this->build_chunk_idx;
      lstate->build_chunk_idx_from = iVar1;
      uVar3 = iVar1 + this->build_chunks_per_thread;
      if (this->build_chunk_count < uVar3) {
        uVar3 = this->build_chunk_count;
      }
      this->build_chunk_idx = uVar3;
      lstate->build_chunk_idx_to = uVar3;
LAB_00bc4a6b:
      bVar2 = true;
      goto LAB_00bc4a6d;
    }
    break;
  case PROBE:
    pPVar4 = unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>,_true>
             ::operator->(&sink->probe_spill);
    if ((ColumnDataConsumer *)
        (pPVar4->consumer).
        super_unique_ptr<duckdb::ColumnDataConsumer,_std::default_delete<duckdb::ColumnDataConsumer>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::ColumnDataConsumer,_std::default_delete<duckdb::ColumnDataConsumer>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ColumnDataConsumer_*,_std::default_delete<duckdb::ColumnDataConsumer>_>
        .super__Head_base<0UL,_duckdb::ColumnDataConsumer_*,_false> != (ColumnDataConsumer *)0x0) {
      pPVar4 = unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>,_true>
               ::operator->(&sink->probe_spill);
      this_00 = unique_ptr<duckdb::ColumnDataConsumer,_std::default_delete<duckdb::ColumnDataConsumer>,_true>
                ::operator->(&pPVar4->consumer);
      bVar2 = ColumnDataConsumer::AssignChunk(this_00,&lstate->probe_local_scan);
      if (bVar2) {
        lstate->local_stage = (this->global_stage)._M_i;
        lstate->empty_ht_probe_in_progress = false;
        goto LAB_00bc4a6b;
      }
    }
    break;
  case SCAN_HT:
    if (this->full_outer_chunk_idx !=
        (this->full_outer_chunk_count).super___atomic_base<unsigned_long>._M_i) {
      lstate->local_stage = (this->global_stage)._M_i;
      lstate->full_outer_chunk_idx_from = this->full_outer_chunk_idx;
      uVar3 = (this->full_outer_chunk_count).super___atomic_base<unsigned_long>._M_i;
      uVar5 = this->full_outer_chunks_per_thread + this->full_outer_chunk_idx;
      if (uVar3 < uVar5) {
        uVar5 = uVar3;
      }
      this->full_outer_chunk_idx = uVar5;
      lstate->full_outer_chunk_idx_to = uVar5;
      goto LAB_00bc4a6b;
    }
    break;
  case DONE:
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Unexpected HashJoinSourceStage in AssignTask!","");
    InternalException::InternalException(this_01,&local_48);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar2 = false;
LAB_00bc4a6d:
  ::std::unique_lock<std::mutex>::~unique_lock(&local_58);
  return bVar2;
}

Assistant:

bool HashJoinGlobalSourceState::AssignTask(HashJoinGlobalSinkState &sink, HashJoinLocalSourceState &lstate) {
	D_ASSERT(lstate.TaskFinished());

	auto guard = Lock();
	switch (global_stage.load()) {
	case HashJoinSourceStage::BUILD:
		if (build_chunk_idx != build_chunk_count) {
			lstate.local_stage = global_stage;
			lstate.build_chunk_idx_from = build_chunk_idx;
			build_chunk_idx = MinValue<idx_t>(build_chunk_count, build_chunk_idx + build_chunks_per_thread);
			lstate.build_chunk_idx_to = build_chunk_idx;
			return true;
		}
		break;
	case HashJoinSourceStage::PROBE:
		if (sink.probe_spill->consumer && sink.probe_spill->consumer->AssignChunk(lstate.probe_local_scan)) {
			lstate.local_stage = global_stage;
			lstate.empty_ht_probe_in_progress = false;
			return true;
		}
		break;
	case HashJoinSourceStage::SCAN_HT:
		if (full_outer_chunk_idx != full_outer_chunk_count) {
			lstate.local_stage = global_stage;
			lstate.full_outer_chunk_idx_from = full_outer_chunk_idx;
			full_outer_chunk_idx =
			    MinValue<idx_t>(full_outer_chunk_count, full_outer_chunk_idx + full_outer_chunks_per_thread);
			lstate.full_outer_chunk_idx_to = full_outer_chunk_idx;
			return true;
		}
		break;
	case HashJoinSourceStage::DONE:
		break;
	default:
		throw InternalException("Unexpected HashJoinSourceStage in AssignTask!");
	}
	return false;
}